

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O1

ecs_vector_t *
ecs_table_set_column(ecs_world_t *world,ecs_table_t *table,int32_t column,ecs_vector_t *vector)

{
  int32_t elem_count;
  ecs_column_t *peVar1;
  ecs_column_t *peVar2;
  int16_t offset;
  ecs_vector_t *vector_00;
  ecs_vector_t *local_28;
  
  local_28 = vector;
  peVar1 = da_get_or_create_column(world,table,column);
  if (local_28 == (ecs_vector_t *)0x0) {
    if (table->data == (ecs_data_t *)0x0) {
      vector_00 = (ecs_vector_t *)0x0;
    }
    else {
      vector_00 = table->data->entities;
    }
    if (vector_00 != (ecs_vector_t *)0x0) {
      elem_count = ecs_vector_count(vector_00);
      peVar2 = da_get_column(table,column);
      if (peVar2 == (ecs_column_t *)0x0) {
        local_28 = (ecs_vector_t *)0x0;
      }
      else {
        local_28 = peVar2->data;
      }
      offset = 0x10;
      if (0x10 < peVar1->alignment) {
        offset = peVar1->alignment;
      }
      if (local_28 == (ecs_vector_t *)0x0) {
        local_28 = _ecs_vector_new((int)peVar1->size,offset,elem_count);
      }
      else {
        _ecs_vector_set_count(&local_28,(int)peVar1->size,offset,elem_count);
      }
    }
  }
  else {
    ecs_vector_assert_size(local_28,(int)peVar1->size);
  }
  peVar1->data = local_28;
  return local_28;
}

Assistant:

ecs_vector_t* ecs_table_set_column(
    ecs_world_t *world,
    ecs_table_t *table,
    int32_t column,
    ecs_vector_t* vector)
{
    ecs_column_t *c = da_get_or_create_column(world, table, column);
    if (vector) {
        ecs_vector_assert_size(vector, c->size);
    } else {
        ecs_vector_t *entities = ecs_table_get_entities(table);
        if (entities) {
            int32_t count = ecs_vector_count(entities);
            vector = ecs_table_get_column(table, column);
            if (!vector) {
                vector = ecs_vector_new_t(c->size, c->alignment, count);
            } else {
                ecs_vector_set_count_t(&vector, c->size, c->alignment, count);
            }
        }
    }
    c->data = vector;
    
    return vector;
}